

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamvbyte.c
# Opt level: O2

uint8_t * svb_decode_avx_d1_init
                    (uint32_t *out,uint8_t *keyPtr,uint8_t *dataPtr,uint64_t count,uint32_t prev)

{
  byte bVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  byte bVar7;
  ulong uVar5;
  uint8_t *puVar6;
  uint8_t *puVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  undefined4 in_register_00000084;
  undefined1 (*pauVar13) [16];
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  xmm_t Vec;
  xmm_t Vec_00;
  xmm_t Vec_01;
  xmm_t Vec_02;
  xmm_t Vec_03;
  xmm_t Vec_04;
  xmm_t Vec_05;
  xmm_t Prev;
  xmm_t Prev_00;
  xmm_t Prev_01;
  xmm_t Prev_02;
  xmm_t Prev_03;
  xmm_t Prev_04;
  xmm_t Prev_05;
  xmm_t Prev_06;
  xmm_t alVar18;
  
  uVar12 = CONCAT44(in_register_00000084,prev);
  if (0x1f < count) {
    auVar15 = vpbroadcastd_avx512vl();
    uVar10 = count >> 5;
    uVar14 = 1;
    puVar8 = keyPtr + uVar10 * 8;
    uVar5 = *(ulong *)(puVar8 + (1 - uVar10) * 8 + -8);
    puVar6 = keyPtr;
    pauVar13 = (undefined1 (*) [16])dataPtr;
    while( true ) {
      auVar15 = vpshufd_avx(auVar15,0xff);
      bVar7 = (byte)(uVar5 >> 8);
      if (uVar10 == uVar14) break;
      uVar2 = *(ulong *)(keyPtr + uVar14 * 8);
      if (uVar5 == 0) {
        auVar15 = vlddqu_avx(*pauVar13);
        vpmovzxbw_avx(auVar15);
        Vec[1] = (longlong)dataPtr;
        Vec[0] = (longlong)puVar6;
        Prev[1] = uVar12;
        Prev[0] = (longlong)puVar8;
        alVar18 = _write_16bit_avx_d1(out,Vec,Prev);
        Vec_00[1] = alVar18[1];
        auVar15 = vlddqu_avx(*(undefined1 (*) [16])(*pauVar13 + 8));
        vpmovzxbw_avx(auVar15);
        Vec_00[0] = (longlong)puVar6;
        Prev_00[1] = uVar12;
        Prev_00[0] = (longlong)puVar8;
        alVar18 = _write_16bit_avx_d1((uint32_t *)((long)out + 0x20),Vec_00,Prev_00);
        Vec_01[1] = alVar18[1];
        auVar15 = vlddqu_avx(pauVar13[1]);
        vpmovzxbw_avx(auVar15);
        Vec_01[0] = (longlong)puVar6;
        Prev_01[1] = uVar12;
        Prev_01[0] = (longlong)puVar8;
        alVar18 = _write_16bit_avx_d1((uint32_t *)((long)out + 0x40),Vec_01,Prev_01);
        Vec_02[1] = alVar18[1];
        auVar15 = vlddqu_avx(*(undefined1 (*) [16])(pauVar13[1] + 8));
        auVar15 = vpmovzxbw_avx(auVar15);
        Vec_02[0] = (longlong)puVar6;
        Prev_02[1] = uVar12;
        Prev_02[0] = (longlong)puVar8;
        alVar18 = _write_16bit_avx_d1((uint32_t *)((long)out + 0x60),Vec_02,Prev_02);
        dataPtr = alVar18[1];
        pauVar13 = pauVar13 + 2;
      }
      else {
        uVar12 = (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                        [uVar5 & 0xff];
        auVar16 = vpshufb_avx(*pauVar13,
                              *(undefined1 (*) [16])
                               (shuffleTable[0] + (uint)((int)(uVar5 & 0xff) << 4)));
        auVar17 = vpslldq_avx(auVar16,4);
        auVar16 = vpaddd_avx(auVar17,auVar16);
        auVar15 = vpaddd_avx(auVar16,auVar15);
        auVar16 = vpslldq_avx(auVar16,8);
        auVar15 = vpaddd_avx(auVar15,auVar16);
        *(undefined1 (*) [16])out = auVar15;
        auVar16 = vpshufd_avx(auVar15,0xff);
        bVar1 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                [bVar7];
        auVar15 = vpshufb_avx(*(undefined1 (*) [16])(*pauVar13 + uVar12),
                              (undefined1  [16])shuffleTable[bVar7]);
        uVar11 = (uint)uVar5 >> 0x10 & 0xff;
        lVar3 = bVar1 + uVar12;
        auVar17 = vpslldq_avx(auVar15,4);
        auVar15 = vpaddd_avx(auVar17,auVar15);
        auVar16 = vpaddd_avx(auVar15,auVar16);
        auVar15 = vpslldq_avx(auVar15,8);
        auVar15 = vpaddd_avx(auVar16,auVar15);
        *(undefined1 (*) [16])((long)out + 0x10) = auVar15;
        auVar16 = vpshufd_avx(auVar15,0xff);
        bVar7 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                [uVar11];
        auVar15 = vpshufb_avx(*(undefined1 (*) [16])(*pauVar13 + bVar1 + uVar12),
                              *(undefined1 (*) [16])(shuffleTable[0] + (uVar11 << 4)));
        uVar12 = uVar5 >> 0x18 & 0xff;
        lVar4 = (ulong)bVar7 + lVar3;
        auVar17 = vpslldq_avx(auVar15,4);
        auVar15 = vpaddd_avx(auVar17,auVar15);
        auVar17 = vpslldq_avx(auVar15,8);
        auVar15 = vpaddd_avx(auVar15,auVar17);
        auVar15 = vpaddd_avx(auVar15,auVar16);
        *(undefined1 (*) [16])((long)out + 0x20) = auVar15;
        auVar16 = vpshufd_avx(auVar15,0xff);
        bVar1 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                [uVar12];
        auVar15 = vpshufb_avx(*(undefined1 (*) [16])(*pauVar13 + (ulong)bVar7 + lVar3),
                              *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar12 << 4)));
        uVar12 = uVar5 >> 0x20 & 0xff;
        lVar3 = (ulong)bVar1 + lVar4;
        auVar17 = vpslldq_avx(auVar15,4);
        auVar15 = vpaddd_avx(auVar17,auVar15);
        auVar17 = vpslldq_avx(auVar15,8);
        auVar15 = vpaddd_avx(auVar15,auVar17);
        auVar15 = vpaddd_avx(auVar15,auVar16);
        *(undefined1 (*) [16])((long)out + 0x30) = auVar15;
        auVar16 = vpshufd_avx(auVar15,0xff);
        bVar7 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                [uVar12];
        auVar15 = vpshufb_avx(*(undefined1 (*) [16])(*pauVar13 + (ulong)bVar1 + lVar4),
                              *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar12 << 4)));
        uVar12 = uVar5 >> 0x28 & 0xff;
        puVar6 = *pauVar13 + (ulong)bVar7 + lVar3;
        auVar17 = vpslldq_avx(auVar15,4);
        auVar15 = vpaddd_avx(auVar17,auVar15);
        auVar17 = vpslldq_avx(auVar15,8);
        auVar15 = vpaddd_avx(auVar15,auVar17);
        auVar15 = vpaddd_avx(auVar15,auVar16);
        *(undefined1 (*) [16])((long)out + 0x40) = auVar15;
        auVar16 = vpshufd_avx(auVar15,0xff);
        bVar1 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                [uVar12];
        auVar15 = vpshufb_avx(*(undefined1 (*) [16])(*pauVar13 + (ulong)bVar7 + lVar3),
                              *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar12 << 4)));
        uVar9 = uVar5 >> 0x30 & 0xff;
        puVar8 = puVar6 + bVar1;
        auVar17 = vpslldq_avx(auVar15,4);
        auVar15 = vpaddd_avx(auVar17,auVar15);
        auVar17 = vpslldq_avx(auVar15,8);
        auVar15 = vpaddd_avx(auVar15,auVar17);
        auVar15 = vpaddd_avx(auVar15,auVar16);
        *(undefined1 (*) [16])((long)out + 0x50) = auVar15;
        auVar16 = vpshufd_avx(auVar15,0xff);
        uVar12 = (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                        [uVar9];
        dataPtr = (uint8_t *)(ulong)(uint)((int)uVar9 << 4);
        auVar15 = vpshufb_avx(*(undefined1 (*) [16])(puVar6 + bVar1),
                              *(undefined1 (*) [16])(dataPtr + 0x18cc00));
        auVar17 = vpslldq_avx(auVar15,4);
        auVar15 = vpaddd_avx(auVar17,auVar15);
        auVar17 = vpslldq_avx(auVar15,8);
        auVar15 = vpaddd_avx(auVar15,auVar17);
        auVar15 = vpaddd_avx(auVar15,auVar16);
        *(undefined1 (*) [16])((long)out + 0x60) = auVar15;
        auVar16 = vpshufd_avx(auVar15,0xff);
        auVar15 = vpshufb_avx(*(undefined1 (*) [16])(puVar8 + uVar12),
                              (undefined1  [16])shuffleTable[uVar5 >> 0x38]);
        pauVar13 = (undefined1 (*) [16])
                   (puVar8 + "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                             [uVar5 >> 0x38] + uVar12);
        auVar17 = vpslldq_avx(auVar15,4);
        auVar15 = vpaddd_avx(auVar17,auVar15);
        auVar17 = vpslldq_avx(auVar15,8);
        auVar15 = vpaddd_avx(auVar15,auVar17);
        auVar15 = vpaddd_avx(auVar15,auVar16);
        *(undefined1 (*) [16])((long)out + 0x70) = auVar15;
      }
      out = (uint32_t *)((long)out + 0x80);
      uVar14 = uVar14 + 1;
      uVar5 = uVar2;
    }
    if (uVar5 == 0) {
      auVar15 = vlddqu_avx(*pauVar13);
      vpmovzxbw_avx(auVar15);
      alVar18[1] = (longlong)dataPtr;
      alVar18[0] = (longlong)puVar6;
      Prev_03[1] = uVar12;
      Prev_03[0] = (longlong)puVar8;
      alVar18 = _write_16bit_avx_d1(out,alVar18,Prev_03);
      Vec_03[1] = alVar18[1];
      auVar15 = vlddqu_avx(*(undefined1 (*) [16])(*pauVar13 + 8));
      vpmovzxbw_avx(auVar15);
      Vec_03[0] = (longlong)puVar6;
      Prev_04[1] = uVar12;
      Prev_04[0] = (longlong)puVar8;
      alVar18 = _write_16bit_avx_d1((uint32_t *)((long)out + 0x20),Vec_03,Prev_04);
      Vec_04[1] = alVar18[1];
      auVar15 = vlddqu_avx(pauVar13[1]);
      vpmovzxbw_avx(auVar15);
      Vec_04[0] = (longlong)puVar6;
      Prev_05[1] = uVar12;
      Prev_05[0] = (longlong)puVar8;
      alVar18 = _write_16bit_avx_d1((uint32_t *)((long)out + 0x40),Vec_04,Prev_05);
      Vec_05[1] = alVar18[1];
      auVar15._8_8_ = 0;
      auVar15._0_8_ = *(ulong *)(pauVar13[1] + 8);
      vpmovzxbw_avx(auVar15);
      Vec_05[0] = (longlong)puVar6;
      Prev_06[1] = uVar12;
      Prev_06[0] = (longlong)puVar8;
      _write_16bit_avx_d1((uint32_t *)((long)out + 0x60),Vec_05,Prev_06);
      uVar11 = *(uint *)(*(undefined1 (*) [16])((long)out + 0x70) + 0xc);
      dataPtr = (uint8_t *)(pauVar13 + 2);
    }
    else {
      uVar12 = (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                      [uVar5 & 0xff];
      auVar16 = vpshufb_avx(*pauVar13,
                            *(undefined1 (*) [16])
                             (shuffleTable[0] + (uint)((int)(uVar5 & 0xff) << 4)));
      auVar17 = vpslldq_avx(auVar16,4);
      auVar16 = vpaddd_avx(auVar17,auVar16);
      auVar15 = vpaddd_avx(auVar16,auVar15);
      auVar16 = vpslldq_avx(auVar16,8);
      auVar15 = vpaddd_avx(auVar15,auVar16);
      *(undefined1 (*) [16])out = auVar15;
      auVar16 = vpshufd_avx(auVar15,0xff);
      bVar1 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
              [bVar7];
      auVar15 = vpshufb_avx(*(undefined1 (*) [16])(*pauVar13 + uVar12),
                            (undefined1  [16])shuffleTable[bVar7]);
      uVar11 = (uint)uVar5 >> 0x10 & 0xff;
      lVar3 = bVar1 + uVar12;
      auVar17 = vpslldq_avx(auVar15,4);
      auVar15 = vpaddd_avx(auVar17,auVar15);
      auVar16 = vpaddd_avx(auVar15,auVar16);
      auVar15 = vpslldq_avx(auVar15,8);
      auVar15 = vpaddd_avx(auVar16,auVar15);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar15;
      auVar16 = vpshufd_avx(auVar15,0xff);
      bVar7 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
              [uVar11];
      auVar15 = vpshufb_avx(*(undefined1 (*) [16])(*pauVar13 + bVar1 + uVar12),
                            *(undefined1 (*) [16])(shuffleTable[0] + (uVar11 << 4)));
      uVar12 = uVar5 >> 0x18 & 0xff;
      lVar4 = (ulong)bVar7 + lVar3;
      auVar17 = vpslldq_avx(auVar15,4);
      auVar15 = vpaddd_avx(auVar17,auVar15);
      auVar17 = vpslldq_avx(auVar15,8);
      auVar15 = vpaddd_avx(auVar15,auVar17);
      auVar15 = vpaddd_avx(auVar15,auVar16);
      *(undefined1 (*) [16])((long)out + 0x20) = auVar15;
      auVar16 = vpshufd_avx(auVar15,0xff);
      bVar1 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
              [uVar12];
      auVar15 = vpshufb_avx(*(undefined1 (*) [16])(*pauVar13 + (ulong)bVar7 + lVar3),
                            *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar12 << 4)));
      uVar12 = uVar5 >> 0x20 & 0xff;
      lVar3 = (ulong)bVar1 + lVar4;
      auVar17 = vpslldq_avx(auVar15,4);
      auVar15 = vpaddd_avx(auVar17,auVar15);
      auVar17 = vpslldq_avx(auVar15,8);
      auVar15 = vpaddd_avx(auVar15,auVar17);
      auVar15 = vpaddd_avx(auVar15,auVar16);
      *(undefined1 (*) [16])((long)out + 0x30) = auVar15;
      auVar16 = vpshufd_avx(auVar15,0xff);
      bVar7 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
              [uVar12];
      auVar15 = vpshufb_avx(*(undefined1 (*) [16])(*pauVar13 + (ulong)bVar1 + lVar4),
                            *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar12 << 4)));
      uVar12 = uVar5 >> 0x28 & 0xff;
      lVar4 = (ulong)bVar7 + lVar3;
      auVar17 = vpslldq_avx(auVar15,4);
      auVar15 = vpaddd_avx(auVar17,auVar15);
      auVar17 = vpslldq_avx(auVar15,8);
      auVar15 = vpaddd_avx(auVar15,auVar17);
      auVar15 = vpaddd_avx(auVar15,auVar16);
      *(undefined1 (*) [16])((long)out + 0x40) = auVar15;
      auVar16 = vpshufd_avx(auVar15,0xff);
      bVar1 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
              [uVar12];
      auVar15 = vpshufb_avx(*(undefined1 (*) [16])(*pauVar13 + (ulong)bVar7 + lVar3),
                            *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar12 << 4)));
      uVar12 = uVar5 >> 0x30 & 0xff;
      lVar3 = (ulong)bVar1 + lVar4;
      auVar17 = vpslldq_avx(auVar15,4);
      auVar15 = vpaddd_avx(auVar17,auVar15);
      auVar17 = vpslldq_avx(auVar15,8);
      auVar15 = vpaddd_avx(auVar15,auVar17);
      auVar15 = vpaddd_avx(auVar15,auVar16);
      *(undefined1 (*) [16])((long)out + 0x50) = auVar15;
      auVar16 = vpshufd_avx(auVar15,0xff);
      bVar7 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
              [uVar12];
      auVar15 = vpshufb_avx(*(undefined1 (*) [16])(*pauVar13 + (ulong)bVar1 + lVar4),
                            *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar12 << 4)));
      auVar17 = vpslldq_avx(auVar15,4);
      auVar15 = vpaddd_avx(auVar17,auVar15);
      auVar17 = vpslldq_avx(auVar15,8);
      auVar15 = vpaddd_avx(auVar15,auVar17);
      auVar15 = vpaddd_avx(auVar15,auVar16);
      *(undefined1 (*) [16])((long)out + 0x60) = auVar15;
      auVar16 = vpshufd_avx(auVar15,0xff);
      auVar15 = vpshufb_avx(*(undefined1 (*) [16])(*pauVar13 + (ulong)bVar7 + lVar3),
                            (undefined1  [16])shuffleTable[uVar5 >> 0x38]);
      dataPtr = *pauVar13 +
                (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                       [uVar5 >> 0x38] + (ulong)bVar7 + lVar3;
      auVar17 = vpslldq_avx(auVar15,4);
      auVar15 = vpaddd_avx(auVar17,auVar15);
      auVar17 = vpslldq_avx(auVar15,8);
      auVar15 = vpaddd_avx(auVar15,auVar17);
      auVar15 = vpaddd_avx(auVar15,auVar16);
      uVar11 = auVar15._12_4_;
      *(undefined1 (*) [16])((long)out + 0x70) = auVar15;
    }
    uVar12 = (ulong)uVar11;
    out = (uint32_t *)((long)out + 0x80);
  }
  puVar6 = svb_decode_scalar_d1_init
                     (out,keyPtr + (count >> 5) * 8,dataPtr,(uint)count & 0x1f,(uint32_t)uVar12);
  return puVar6;
}

Assistant:

uint8_t *svb_decode_avx_d1_init(uint32_t *out, uint8_t *__restrict__ keyPtr,
                                uint8_t *__restrict__ dataPtr, uint64_t count,
                                uint32_t prev) {
  uint64_t keybytes = count / 4; // number of key bytes
  if (keybytes >= 8) {
    xmm_t Prev = _mm_set1_epi32(prev);
    xmm_t Data;

    int64_t Offset = -(int64_t)keybytes / 8 + 1;

    const uint64_t *keyPtr64 = (const uint64_t *)keyPtr - Offset;
    uint64_t nextkeys = keyPtr64[Offset];
    for (; Offset != 0; ++Offset) {
      uint64_t keys = nextkeys;
      nextkeys = keyPtr64[Offset + 1];
      // faster 16-bit delta since we only have 8-bit values
      if (!keys) { // 32 1-byte ints in a row

        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr)));
        Prev = _write_16bit_avx_d1(out, Data, Prev);
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 8)));
        Prev = _write_16bit_avx_d1(out + 8, Data, Prev);
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 16)));
        Prev = _write_16bit_avx_d1(out + 16, Data, Prev);
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 24)));
        Prev = _write_16bit_avx_d1(out + 24, Data, Prev);
        out += 32;
        dataPtr += 32;
        continue;
      }

      Data = _decode_avx(keys & 0x00FF, &dataPtr);
      Prev = _write_avx_d1(out, Data, Prev);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      Prev = _write_avx_d1(out + 4, Data, Prev);

      keys >>= 16;
      Data = _decode_avx((keys & 0x00FF), &dataPtr);
      Prev = _write_avx_d1(out + 8, Data, Prev);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      Prev = _write_avx_d1(out + 12, Data, Prev);

      keys >>= 16;
      Data = _decode_avx((keys & 0x00FF), &dataPtr);
      Prev = _write_avx_d1(out + 16, Data, Prev);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      Prev = _write_avx_d1(out + 20, Data, Prev);

      keys >>= 16;
      Data = _decode_avx((keys & 0x00FF), &dataPtr);
      Prev = _write_avx_d1(out + 24, Data, Prev);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      Prev = _write_avx_d1(out + 28, Data, Prev);

      out += 32;
    }
    {
      uint64_t keys = nextkeys;
      // faster 16-bit delta since we only have 8-bit values
      if (!keys) { // 32 1-byte ints in a row
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr)));
        Prev = _write_16bit_avx_d1(out, Data, Prev);
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 8)));
        Prev = _write_16bit_avx_d1(out + 8, Data, Prev);
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 16)));
        Prev = _write_16bit_avx_d1(out + 16, Data, Prev);
        Data = _mm_cvtepu8_epi16(_mm_loadl_epi64((xmm_t *)(dataPtr + 24)));
        _write_16bit_avx_d1(out + 24, Data, Prev);
        out += 32;
        dataPtr += 32;

      } else {

        Data = _decode_avx(keys & 0x00FF, &dataPtr);
        Prev = _write_avx_d1(out, Data, Prev);
        Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
        Prev = _write_avx_d1(out + 4, Data, Prev);

        keys >>= 16;
        Data = _decode_avx((keys & 0x00FF), &dataPtr);
        Prev = _write_avx_d1(out + 8, Data, Prev);
        Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
        Prev = _write_avx_d1(out + 12, Data, Prev);

        keys >>= 16;
        Data = _decode_avx((keys & 0x00FF), &dataPtr);
        Prev = _write_avx_d1(out + 16, Data, Prev);
        Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
        Prev = _write_avx_d1(out + 20, Data, Prev);

        keys >>= 16;
        Data = _decode_avx((keys & 0x00FF), &dataPtr);
        Prev = _write_avx_d1(out + 24, Data, Prev);
        Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
        _write_avx_d1(out + 28, Data, Prev);

        out += 32;
      }
    }
    prev = out[-1];
  }
  uint64_t consumedkeys = keybytes - (keybytes & 7);
  return svb_decode_scalar_d1_init(out, keyPtr + consumedkeys, dataPtr,
                                   count & 31, prev);
}